

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

int symstrcomp(object *left,char *right)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = (uint)left->header >> 2;
  sVar2 = strlen(right);
  uVar3 = (uint)sVar2;
  uVar6 = uVar5;
  if ((int)uVar3 <= (int)uVar5) {
    uVar6 = uVar3;
  }
  if (0 < (int)uVar6) {
    uVar4 = 0;
    do {
      bVar1 = *(byte *)((long)&left[1].header + uVar4);
      if (bVar1 != right[uVar4]) {
        return (uint)bVar1 - (uint)(byte)right[uVar4];
      }
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  return uVar5 - uVar3;
}

Assistant:

int symstrcomp(struct object *left, const char *right)
{
    int leftsize = SIZE(left);
    int rightsize = (int)strlen(right);
    int minsize = leftsize < rightsize ? leftsize : rightsize;
    register int i;

    if (rightsize < minsize) {
        minsize = rightsize;
    }
    for (i = 0; i < minsize; i++) {
        if ((bytePtr(left)[i]) != (unsigned char)(right[i])) {
            return bytePtr(left)[i]-(unsigned char)(right[i]);
        }
    }
    return leftsize - rightsize;
}